

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.cpp
# Opt level: O2

bool __thiscall
bitfoot::Bitfoot::SetEngineOption(Bitfoot *this,string *optionName,string *optionValue)

{
  char *pcVar1;
  bool bVar2;
  __type _Var3;
  int iVar4;
  undefined4 uVar5;
  int64_t iVar6;
  undefined4 *puVar7;
  undefined1 *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = (optionName->_M_dataplus)._M_p;
  std::__cxx11::string::string((string *)&local_50,(string *)(_optHash + 0x10));
  iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  if ((iVar4 == 0) &&
     (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optHash,optionValue), bVar2)) {
    iVar6 = senjo::EngineOption::GetIntValue((EngineOption *)_optHash);
    SetHashSize(this,iVar6);
    return true;
  }
  pcVar1 = (optionName->_M_dataplus)._M_p;
  std::__cxx11::string::string((string *)&local_50,(string *)(_optClearHash + 0x10));
  iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  if (iVar4 == 0) {
    TranspositionTable::Clear((TranspositionTable *)_tt);
    return true;
  }
  pcVar1 = (optionName->_M_dataplus)._M_p;
  std::__cxx11::string::string((string *)&local_50,(string *)(_optContempt + 0x10));
  iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_50);
  if ((iVar4 == 0) &&
     (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optContempt,optionValue), bVar2)) {
    iVar6 = senjo::EngineOption::GetIntValue((EngineOption *)_optContempt);
    uVar5 = (undefined4)iVar6;
    puVar7 = &_contempt;
  }
  else {
    pcVar1 = (optionName->_M_dataplus)._M_p;
    std::__cxx11::string::string((string *)&local_50,(string *)(_optDelta + 0x10));
    iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    if ((iVar4 != 0) ||
       (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optDelta,optionValue), !bVar2)) {
      pcVar1 = (optionName->_M_dataplus)._M_p;
      std::__cxx11::string::string((string *)&local_50,(string *)(_optEXT + 0x10));
      iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      if ((iVar4 == 0) &&
         (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optEXT,optionValue), bVar2)) {
        std::__cxx11::string::string((string *)&local_50,(string *)(_optEXT + 0x30));
        _Var3 = std::operator==(&local_50,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )_TRUE_abi_cxx11_);
        puVar8 = &_ext;
      }
      else {
        pcVar1 = (optionName->_M_dataplus)._M_p;
        std::__cxx11::string::string((string *)&local_50,(string *)(_optFutility + 0x10));
        iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
        if ((iVar4 == 0) &&
           (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optFutility,optionValue), bVar2))
        {
          iVar6 = senjo::EngineOption::GetIntValue((EngineOption *)_optFutility);
          uVar5 = (undefined4)iVar6;
          puVar7 = &_futility;
          goto LAB_001060b1;
        }
        pcVar1 = (optionName->_M_dataplus)._M_p;
        std::__cxx11::string::string((string *)&local_50,(string *)(_optIID + 0x10));
        iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
        if ((iVar4 == 0) &&
           (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optIID,optionValue), bVar2)) {
          std::__cxx11::string::string((string *)&local_50,(string *)(_optIID + 0x30));
          _Var3 = std::operator==(&local_50,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)_TRUE_abi_cxx11_);
          puVar8 = &_iid;
        }
        else {
          pcVar1 = (optionName->_M_dataplus)._M_p;
          std::__cxx11::string::string((string *)&local_50,(string *)(_optLMR + 0x10));
          iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&local_50);
          if ((iVar4 == 0) &&
             (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optLMR,optionValue), bVar2)) {
            std::__cxx11::string::string((string *)&local_50,(string *)(_optLMR + 0x30));
            _Var3 = std::operator==(&local_50,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)_TRUE_abi_cxx11_);
            puVar8 = &_lmr;
          }
          else {
            pcVar1 = (optionName->_M_dataplus)._M_p;
            std::__cxx11::string::string((string *)&local_50,(string *)(_optNMP + 0x10));
            iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&local_50);
            if ((iVar4 == 0) &&
               (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optNMP,optionValue), bVar2))
            {
              std::__cxx11::string::string((string *)&local_50,(string *)(_optNMP + 0x30));
              _Var3 = std::operator==(&local_50,
                                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)_TRUE_abi_cxx11_);
              puVar8 = &_nmp;
            }
            else {
              pcVar1 = (optionName->_M_dataplus)._M_p;
              std::__cxx11::string::string((string *)&local_50,(string *)(_optNMR + 0x10));
              iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
              std::__cxx11::string::~string((string *)&local_50);
              if ((iVar4 == 0) &&
                 (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optNMR,optionValue), bVar2)
                 ) {
                std::__cxx11::string::string((string *)&local_50,(string *)(_optNMR + 0x30));
                _Var3 = std::operator==(&local_50,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)_TRUE_abi_cxx11_);
                puVar8 = &_nmr;
              }
              else {
                pcVar1 = (optionName->_M_dataplus)._M_p;
                std::__cxx11::string::string((string *)&local_50,(string *)(_optOneReply + 0x10));
                iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
                std::__cxx11::string::~string((string *)&local_50);
                if ((iVar4 != 0) ||
                   (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optOneReply,optionValue),
                   !bVar2)) {
                  pcVar1 = (optionName->_M_dataplus)._M_p;
                  std::__cxx11::string::string((string *)&local_50,(string *)(_optRZR + 0x10));
                  iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
                  std::__cxx11::string::~string((string *)&local_50);
                  if ((iVar4 == 0) &&
                     (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optRZR,optionValue),
                     bVar2)) {
                    iVar6 = senjo::EngineOption::GetIntValue((EngineOption *)_optRZR);
                    uVar5 = (undefined4)iVar6;
                    puVar7 = &_rzr;
                  }
                  else {
                    pcVar1 = (optionName->_M_dataplus)._M_p;
                    std::__cxx11::string::string((string *)&local_50,(string *)(_optTempo + 0x10));
                    iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
                    std::__cxx11::string::~string((string *)&local_50);
                    if ((iVar4 == 0) &&
                       (bVar2 = senjo::EngineOption::SetValue((EngineOption *)_optTempo,optionValue)
                       , bVar2)) {
                      iVar6 = senjo::EngineOption::GetIntValue((EngineOption *)_optTempo);
                      uVar5 = (undefined4)iVar6;
                      puVar7 = &_tempo;
                    }
                    else {
                      pcVar1 = (optionName->_M_dataplus)._M_p;
                      std::__cxx11::string::string((string *)&local_50,(string *)(_optTest + 0x10));
                      iVar4 = strcasecmp(pcVar1,local_50._M_dataplus._M_p);
                      std::__cxx11::string::~string((string *)&local_50);
                      if ((iVar4 != 0) ||
                         (bVar2 = senjo::EngineOption::SetValue
                                            ((EngineOption *)_optTest,optionValue), !bVar2)) {
                        return false;
                      }
                      iVar6 = senjo::EngineOption::GetIntValue((EngineOption *)_optTest);
                      uVar5 = (undefined4)iVar6;
                      puVar7 = (undefined4 *)&_test;
                    }
                  }
                  goto LAB_001060b1;
                }
                std::__cxx11::string::string((string *)&local_50,(string *)(_optOneReply + 0x30));
                _Var3 = std::operator==(&local_50,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)_TRUE_abi_cxx11_);
                puVar8 = &_oneReply;
              }
            }
          }
        }
      }
      *puVar8 = _Var3;
      std::__cxx11::string::~string((string *)&local_50);
      return true;
    }
    iVar6 = senjo::EngineOption::GetIntValue((EngineOption *)_optDelta);
    uVar5 = (undefined4)iVar6;
    puVar7 = &_delta;
  }
LAB_001060b1:
  *puVar7 = uVar5;
  return true;
}

Assistant:

bool Bitfoot::SetEngineOption(const std::string& optionName,
                             const std::string& optionValue)
{
  if (!stricmp(optionName.c_str(), _optHash.GetName().c_str())) {
    if (_optHash.SetValue(optionValue)) {
      SetHashSize(_optHash.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optClearHash.GetName().c_str())) {
    ClearHash();
    return true;
  }
  if (!stricmp(optionName.c_str(), _optContempt.GetName().c_str())) {
    if (_optContempt.SetValue(optionValue)) {
      _contempt = static_cast<int>(_optContempt.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optDelta.GetName().c_str())) {
    if (_optDelta.SetValue(optionValue)) {
      _delta = static_cast<int>(_optDelta.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optEXT.GetName().c_str())) {
    if (_optEXT.SetValue(optionValue)) {
      _ext = (_optEXT.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optFutility.GetName().c_str())) {
    if (_optFutility.SetValue(optionValue)) {
      _futility = static_cast<int>(_optFutility.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optIID.GetName().c_str())) {
    if (_optIID.SetValue(optionValue)) {
      _iid = (_optIID.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optLMR.GetName().c_str())) {
    if (_optLMR.SetValue(optionValue)) {
      _lmr = (_optLMR.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName .c_str(), _optNMP.GetName().c_str())) {
    if (_optNMP.SetValue(optionValue)) {
      _nmp = (_optNMP.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optNMR.GetName().c_str())) {
    if (_optNMR.SetValue(optionValue)) {
      _nmr = (_optNMR.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName .c_str(), _optOneReply.GetName().c_str())) {
    if (_optOneReply.SetValue(optionValue)) {
      _oneReply = (_optOneReply.GetValue() == _TRUE);
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optRZR.GetName().c_str())) {
    if (_optRZR.SetValue(optionValue)) {
      _rzr = static_cast<int>(_optRZR.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optTempo.GetName().c_str())) {
    if (_optTempo.SetValue(optionValue)) {
      _tempo = static_cast<int>(_optTempo.GetIntValue());
      return true;
    }
  }
  if (!stricmp(optionName.c_str(), _optTest.GetName().c_str())) {
    if (_optTest.SetValue(optionValue)) {
      _test = static_cast<int>(_optTest.GetIntValue());
      return true;
    }
  }
  return false;
}